

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::BinaryExpressionSyntax::BinaryExpressionSyntax
          (BinaryExpressionSyntax *this,SyntaxKind kind,ExpressionSyntax *left,Token operatorToken,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ExpressionSyntax *right)

{
  pointer ppAVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ExpressionSyntax *pEVar5;
  undefined8 uVar6;
  long lVar7;
  ExpressionSyntax *local_38;
  
  uVar6 = operatorToken._0_8_;
  (this->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_ExpressionSyntax).super_SyntaxNode.kind = kind;
  local_38 = left;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->left,&local_38);
  (this->operatorToken).kind = (short)uVar6;
  (this->operatorToken).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->operatorToken).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->operatorToken).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->operatorToken).info = operatorToken.info;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->attributes).super_SyntaxListBase.childCount = (attributes->super_SyntaxListBase).childCount
  ;
  sVar2 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  data_ = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .data_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  size_ = sVar2;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004703a8;
  local_38 = right;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->right,&local_38);
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::get(&this->left);
  (pEVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppAVar1 = (this->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    **(undefined8 **)((long)ppAVar1 + lVar7) = this;
  }
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::get(&this->right);
  (pEVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

BinaryExpressionSyntax(SyntaxKind kind, ExpressionSyntax& left, Token operatorToken, const SyntaxList<AttributeInstanceSyntax>& attributes, ExpressionSyntax& right) :
        ExpressionSyntax(kind), left(&left), operatorToken(operatorToken), attributes(attributes), right(&right) {
        this->left->parent = this;
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->right->parent = this;
    }